

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O2

EdgeType raviX_get_edge_type(Graph *g,nodeId_t from,nodeId_t to)

{
  GraphNode *pGVar1;
  GraphNodeLink *pGVar2;
  int64_t iVar3;
  EdgeType EVar4;
  EdgeType EVar5;
  
  EVar4 = EDGE_TYPE_UNCLASSIFIED;
  EVar5 = EDGE_TYPE_UNCLASSIFIED;
  if ((from < g->allocated) && (pGVar1 = g->nodes[from], EVar5 = EVar4, pGVar1 != (GraphNode *)0x0))
  {
    iVar3 = node_list_search(&pGVar1->succs,to);
    if ((-1 < iVar3) && (pGVar2 = (pGVar1->succs).links, pGVar2 != (GraphNodeLink *)0x0)) {
      EVar5 = (EdgeType)pGVar2[iVar3].edge_type;
    }
  }
  return EVar5;
}

Assistant:

enum EdgeType raviX_get_edge_type(Graph *g, nodeId_t from, nodeId_t to)
{
	GraphNode *prednode = raviX_get_node(g, from);
	if (prednode == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	struct GraphNodeLink *node_link = node_list_get(&prednode->succs, to);
	if (node_link == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	return (enum EdgeType) node_link->edge_type;
}